

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelctemp.h
# Opt level: O1

int __thiscall
TPZIntelGen<pzshape::TPZShapePrism>::ClassId(TPZIntelGen<pzshape::TPZShapePrism> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string local_48;
  TPZPrism local_28;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"TPZIntelGen","");
  uVar1 = Hash(&local_48);
  iVar2 = TPZInterpolatedElement::ClassId(&this->super_TPZInterpolatedElement);
  local_28.super_TPZSavable._vptr_TPZSavable = (TPZSavable)&PTR__TPZShapePrism_01928600;
  iVar3 = pztopology::TPZPrism::ClassId(&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZIntelGen<TSHAPE>::ClassId() const{
    return Hash("TPZIntelGen") ^ TPZInterpolatedElement::ClassId() << 1 ^ TSHAPE().ClassId() << 2;
}